

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

bool __thiscall
google::protobuf::anon_unknown_0::TestIgnorer::IsIgnored
          (TestIgnorer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  ushort *puVar1;
  bool bVar2;
  _Alloc_hider __s1;
  bool bVar3;
  int iVar4;
  pointer pSVar5;
  ulong uVar6;
  long lVar7;
  size_type __rlen;
  bool bVar8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  FieldDescriptor *local_98;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98 = field;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,anon_var_dwarf_a22956 + 5);
  pSVar5 = (parent_fields->
           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((parent_fields->
      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar5) {
    lVar7 = 0x18;
    uVar6 = 0;
    do {
      puVar1 = *(ushort **)(*(long *)((long)&pSVar5->message1 + lVar7) + 8);
      local_90.piece_._M_len = (size_t)*puVar1;
      local_90.piece_._M_str = (char *)(~local_90.piece_._M_len + (long)puVar1);
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = ".";
      absl::lts_20250127::StrAppend(&local_b8,&local_90,&local_60);
      uVar6 = uVar6 + 1;
      pSVar5 = (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x60;
    } while (uVar6 < (ulong)(((long)(parent_fields->
                                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 5)
                            * -0x5555555555555555));
  }
  puVar1 = (ushort *)(local_98->all_names_).payload_;
  local_90.piece_._M_len = (size_t)*puVar1;
  local_90.piece_._M_str = (char *)((long)puVar1 + ~local_90.piece_._M_len);
  absl::lts_20250127::StrAppend(&local_b8,&local_90);
  __s1._M_p = local_b8._M_dataplus._M_p;
  lVar7 = 0;
  bVar3 = true;
  do {
    while (bVar2 = bVar3,
          local_b8._M_string_length == (&protobuf::(anonymous_namespace)::kIgnoredFields)[lVar7 * 2]
          ) {
      if (local_b8._M_string_length == 0) {
        bVar8 = true;
        goto LAB_00b8552f;
      }
      iVar4 = bcmp(__s1._M_p,(&PTR_anon_var_dwarf_308d242_018f21a8)[lVar7 * 2],
                   local_b8._M_string_length);
      bVar8 = iVar4 == 0;
      if (bVar8) goto LAB_00b8552f;
      lVar7 = 1;
      bVar3 = false;
      if (!bVar2) goto LAB_00b8552f;
    }
    lVar7 = 1;
    bVar8 = false;
    bVar3 = false;
  } while (bVar2);
LAB_00b8552f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s1._M_p != &local_b8.field_2) {
    operator_delete(__s1._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool IsIgnored(const Message& message1, const Message& message2,
                 const FieldDescriptor* field,
                 const std::vector<util::MessageDifferencer::SpecificField>&
                     parent_fields) override {
    std::string name = "";
    for (size_t i = 0; i < parent_fields.size(); ++i) {
      absl::StrAppend(&name, parent_fields[i].field->name(), ".");
    }
    absl::StrAppend(&name, field->name());
    for (size_t i = 0; i < ABSL_ARRAYSIZE(kIgnoredFields); ++i) {
      if (name == kIgnoredFields[i]) {
        return true;
      }
    }
    return false;
  }